

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

CoatedConductorMaterial *
pbrt::CoatedConductorMaterial::Create
          (TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uintptr_t iptr_1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CoatedConductorMaterial *pCVar4;
  uintptr_t iptr;
  string sStack_e8;
  bool remapRoughness;
  LayeredBxDFConfig local_c4;
  allocator<char> local_c1;
  FloatTextureHandle g;
  SpectrumTextureHandle albedo;
  SpectrumTextureHandle conductorEta;
  FloatTextureHandle conductorVRoughness;
  FloatTextureHandle thickness;
  FloatTextureHandle interfaceVRoughness;
  FloatTextureHandle interfaceURoughness;
  FloatTextureHandle displacement;
  SpectrumTextureHandle k;
  FloatTextureHandle conductorURoughness;
  pbrt local_58 [8];
  pbrt local_50 [8];
  FloatTextureHandle interfaceEta;
  Allocator alloc_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
  *local_38;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"interface.uroughness",(allocator<char> *)&g);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&interfaceURoughness,(string *)parameters,
             (memory_resource *)&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"interface.vroughness",(allocator<char> *)&g);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&interfaceVRoughness,(string *)parameters,
             (memory_resource *)&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  if (((ulong)interfaceURoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_e8,"interface.roughness",(allocator<char> *)&thickness);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&g,(string *)parameters,0.0,
               (memory_resource *)&sStack_e8);
    interfaceURoughness = g;
    std::__cxx11::string::~string((string *)&sStack_e8);
  }
  if (((ulong)interfaceVRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_e8,"interface.roughness",(allocator<char> *)&thickness);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&g,(string *)parameters,0.0,
               (memory_resource *)&sStack_e8);
    interfaceVRoughness = g;
    std::__cxx11::string::~string((string *)&sStack_e8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"thickness",(allocator<char> *)&g);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&thickness,(string *)parameters,0.01,
             (memory_resource *)&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"interface.eta",(allocator<char> *)&g);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&interfaceEta,(string *)parameters,1.5,
             (memory_resource *)&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"conductor.uroughness",(allocator<char> *)&g);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&conductorURoughness,(string *)parameters,
             (memory_resource *)&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"conductor.vroughness",(allocator<char> *)&g);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&conductorVRoughness,(string *)parameters,
             (memory_resource *)&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  if (((ulong)conductorURoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_e8,"conductor.roughness",(allocator<char> *)&conductorEta);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&g,(string *)parameters,0.0,
               (memory_resource *)&sStack_e8);
    conductorURoughness = g;
    std::__cxx11::string::~string((string *)&sStack_e8);
  }
  if (((ulong)conductorVRoughness.
              super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              .bits & 0xffffffffffff) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_e8,"conductor.roughness",(allocator<char> *)&conductorEta);
    TextureParameterDictionary::GetFloatTexture
              ((TextureParameterDictionary *)&g,(string *)parameters,0.0,
               (memory_resource *)&sStack_e8);
    conductorVRoughness = g;
    std::__cxx11::string::~string((string *)&sStack_e8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"conductor.eta",(allocator<char> *)&k);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&g,"metal-Cu-eta",(allocator<char> *)&albedo);
  GetNamedSpectrum(local_50,(string *)&g);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&conductorEta,(string *)parameters,
             (SpectrumHandle *)&sStack_e8,(SpectrumType)local_50,(Allocator)0x1);
  std::__cxx11::string::~string((string *)&g);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"conductor.k",(allocator<char> *)&albedo);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&g,"metal-Cu-k",(allocator<char> *)&displacement);
  GetNamedSpectrum(local_58,(string *)&g);
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&k,(string *)parameters,(SpectrumHandle *)&sStack_e8,
             (SpectrumType)local_58,(Allocator)0x1);
  std::__cxx11::string::~string((string *)&g);
  std::__cxx11::string::~string((string *)&sStack_e8);
  local_c4.twoSided = '\x01';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"maxdepth",(allocator<char> *)&g);
  iVar2 = TextureParameterDictionary::GetOneInt(parameters,&sStack_e8,10);
  local_c4.maxDepth = (uint8_t)iVar2;
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"nsamples",(allocator<char> *)&g);
  iVar2 = TextureParameterDictionary::GetOneInt(parameters,&sStack_e8,1);
  local_c4.nSamples = (uint8_t)iVar2;
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"g",(allocator<char> *)&albedo);
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)&g,(string *)parameters,0.0,(memory_resource *)&sStack_e8
            );
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"albedo",(allocator<char> *)&displacement);
  local_38 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::SpectrumTextureHandle>_>_>
              *)0x0;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)&albedo,(string *)parameters,(SpectrumHandle *)&sStack_e8
             ,(SpectrumType)&local_38,(Allocator)0x0);
  std::__cxx11::string::~string((string *)&sStack_e8);
  if (((ulong)albedo.
              super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
              .bits & 0xffffffffffff) == 0) {
    iVar2 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,4);
    *(undefined4 *)CONCAT44(extraout_var,iVar2) = 0;
    iVar3 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,8);
    albedo.
    super_TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    .bits = (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
             )(CONCAT44(extraout_var_00,iVar3) | 0x7000000000000);
    *(ulong *)CONCAT44(extraout_var_00,iVar3) = CONCAT44(extraout_var,iVar2) | 0x1000000000000;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"displacement",(allocator<char> *)&remapRoughness);
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)&displacement,(string *)parameters,
             (memory_resource *)&sStack_e8);
  std::__cxx11::string::~string((string *)&sStack_e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_e8,"remaproughness",&local_c1);
  bVar1 = TextureParameterDictionary::GetOneBool(parameters,&sStack_e8,true);
  std::__cxx11::string::~string((string *)&sStack_e8);
  remapRoughness = bVar1;
  pCVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CoatedConductorMaterial,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,bool&,pbrt::LayeredBxDFConfig&>
                     (&alloc_local,&interfaceURoughness,&interfaceVRoughness,&thickness,
                      &interfaceEta,&g,&albedo,&conductorURoughness,&conductorVRoughness,
                      &conductorEta,&k,&displacement,&remapRoughness,&local_c4);
  return pCVar4;
}

Assistant:

CoatedConductorMaterial *CoatedConductorMaterial::Create(
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    // interface
    FloatTextureHandle interfaceURoughness =
        parameters.GetFloatTextureOrNull("interface.uroughness", alloc);
    FloatTextureHandle interfaceVRoughness =
        parameters.GetFloatTextureOrNull("interface.vroughness", alloc);
    if (!interfaceURoughness)
        interfaceURoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);
    if (!interfaceVRoughness)
        interfaceVRoughness =
            parameters.GetFloatTexture("interface.roughness", 0.f, alloc);

    FloatTextureHandle thickness = parameters.GetFloatTexture("thickness", .01, alloc);
    FloatTextureHandle interfaceEta =
        parameters.GetFloatTexture("interface.eta", 1.5, alloc);

    // conductor
    FloatTextureHandle conductorURoughness =
        parameters.GetFloatTextureOrNull("conductor.uroughness", alloc);
    FloatTextureHandle conductorVRoughness =
        parameters.GetFloatTextureOrNull("conductor.vroughness", alloc);
    if (!conductorURoughness)
        conductorURoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    if (!conductorVRoughness)
        conductorVRoughness =
            parameters.GetFloatTexture("conductor.roughness", 0.f, alloc);
    SpectrumTextureHandle conductorEta = parameters.GetSpectrumTexture(
        "conductor.eta", GetNamedSpectrum("metal-Cu-eta"), SpectrumType::General, alloc);
    SpectrumTextureHandle k = parameters.GetSpectrumTexture(
        "conductor.k", GetNamedSpectrum("metal-Cu-k"), SpectrumType::General, alloc);

    LayeredBxDFConfig config;
    config.maxDepth = parameters.GetOneInt("maxdepth", config.maxDepth);
    config.nSamples = parameters.GetOneInt("nsamples", config.nSamples);

    FloatTextureHandle g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTextureHandle albedo = parameters.GetSpectrumTexture(
        "albedo", nullptr, SpectrumType::Reflectance, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    return alloc.new_object<CoatedConductorMaterial>(
        interfaceURoughness, interfaceVRoughness, thickness, interfaceEta, g, albedo,
        conductorURoughness, conductorVRoughness, conductorEta, k, displacement,
        remapRoughness, config);
}